

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target)

{
  bool deterministic;
  size_t sVar1;
  uint8_t *puVar2;
  undefined1 local_58 [8];
  EpsCopyOutputStream stream;
  uint8_t *target_local;
  UnknownFieldSet *unknown_fields_local;
  
  stream._56_8_ = target;
  sVar1 = ComputeUnknownFieldsSize(unknown_fields);
  deterministic = io::CodedOutputStream::IsDefaultSerializationDeterministic();
  io::EpsCopyOutputStream::EpsCopyOutputStream
            ((EpsCopyOutputStream *)local_58,target,(int)sVar1,deterministic);
  puVar2 = InternalSerializeUnknownFieldsToArray
                     (unknown_fields,(uint8_t *)stream._56_8_,(EpsCopyOutputStream *)local_58);
  return puVar2;
}

Assistant:

static uint8_t* SerializeUnknownFieldsToArray(
      const UnknownFieldSet& unknown_fields, uint8_t* target) {
    io::EpsCopyOutputStream stream(
        target, static_cast<int>(ComputeUnknownFieldsSize(unknown_fields)),
        io::CodedOutputStream::IsDefaultSerializationDeterministic());
    return InternalSerializeUnknownFieldsToArray(unknown_fields, target,
                                                 &stream);
  }